

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O1

void __thiscall
slang::ast::ForeachConstraint::serializeTo(ForeachConstraint *this,ASTSerializer *serializer)

{
  size_type sVar1;
  long lVar2;
  pointer this_00;
  string_view name;
  string local_50;
  
  ASTSerializer::write(serializer,8,"arrayRef",(size_t)this->arrayRef);
  name._M_str = "loopDims";
  name._M_len = 8;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->loopDims).size_;
  if (sVar1 != 0) {
    this_00 = (this->loopDims).data_;
    lVar2 = sVar1 * 0x18;
    do {
      ASTSerializer::startObject(serializer);
      if ((this_00->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_engaged == true) {
        ConstantRange::toString_abi_cxx11_(&local_50,(ConstantRange *)this_00);
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"[]","");
      }
      ASTSerializer::write(serializer,5,"range",(size_t)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (this_00->loopVar != (IteratorSymbol *)0x0) {
        ASTSerializer::write(serializer,3,"var",(size_t)this_00->loopVar);
      }
      ASTSerializer::endObject(serializer);
      this_00 = this_00 + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  ASTSerializer::endArray(serializer);
  ASTSerializer::write(serializer,4,"body",(size_t)this->body);
  return;
}

Assistant:

void ForeachConstraint::serializeTo(ASTSerializer& serializer) const {
    serializer.write("arrayRef", arrayRef);

    serializer.startArray("loopDims");
    for (auto& r : loopDims) {
        serializer.startObject();
        serializer.write("range", r.range ? r.range->toString() : "[]");
        if (r.loopVar)
            serializer.write("var", *r.loopVar);
        serializer.endObject();
    }
    serializer.endArray();

    serializer.write("body", body);
}